

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

void glist_delete(_glist *x,t_gobj *y)

{
  int iVar1;
  int flag;
  int iVar2;
  t_symbol *ptVar3;
  t_gotfn p_Var4;
  _glist *x_00;
  _rtext *x_01;
  char *tag_00;
  _glist *p_Var5;
  t_template *ptVar6;
  t_object *who;
  char local_a8 [8];
  char tag [80];
  _glist *gl;
  int wasdeleting;
  int drawcommand;
  _rtext *rtext;
  _glist *canvas;
  t_gotfn chkdsp;
  t_object *ob;
  t_gobj *g;
  t_gobj *y_local;
  _glist *x_local;
  
  ptVar3 = gensym("dsp");
  p_Var4 = zgetfn(&y->g_pd,ptVar3);
  x_00 = glist_getcanvas(x);
  _wasdeleting = (_rtext *)0x0;
  iVar1 = class_isdrawcommand(y->g_pd);
  if (y->g_pd == canvas_class) {
    canvas_closebang((_glist *)y);
  }
  flag = canvas_setdeleting(x_00,1);
  if (x->gl_editor != (t_editor *)0x0) {
    if ((x_00->gl_editor != (t_editor *)0x0) && (x_00->gl_editor->e_grab == y)) {
      x_00->gl_editor->e_grab = (t_gobj *)0x0;
    }
    if (x->gl_editor->e_grab == y) {
      x->gl_editor->e_grab = (t_gobj *)0x0;
    }
    iVar2 = glist_isselected(x,y);
    if (iVar2 != 0) {
      glist_deselect(x,y);
    }
    if (y->g_pd == canvas_class) {
      if (((*(ushort *)&y[0xe].g_next >> 8 & 1) == 0) || (iVar2 = glist_isvisible(x), iVar2 == 0)) {
        iVar2 = glist_isvisible(x);
        if (iVar2 != 0) {
          x_01 = glist_findrtext(x,(t_text *)y);
          tag_00 = rtext_gettag(x_01);
          text_eraseborder((t_text *)y,x,tag_00);
        }
      }
      else {
        sprintf(local_a8,"graph%lx",y);
        glist_eraseiofor(x,(t_object *)y,local_a8);
      }
    }
  }
  if (iVar1 != 0) {
    p_Var5 = glist_getcanvas(x);
    ptVar3 = canvas_makebindsym(p_Var5->gl_name);
    ptVar6 = template_findbyname(ptVar3);
    canvas_redrawallfortemplate(ptVar6,2);
  }
  gobj_delete(y,x);
  iVar2 = glist_isvisible(x_00);
  if (iVar2 != 0) {
    gobj_vis(y,x,0);
  }
  if (((x->gl_editor != (t_editor *)0x0) && (who = pd_checkobject(&y->g_pd), who != (t_object *)0x0)
      ) && (_wasdeleting = glist_findrtext(x,who), _wasdeleting == (_rtext *)0x0)) {
    _wasdeleting = rtext_new(x,who);
  }
  if (x->gl_list == y) {
    x->gl_list = y->g_next;
  }
  else {
    for (ob = (t_object *)x->gl_list; ob != (t_object *)0x0; ob = (t_object *)(ob->te_g).g_next) {
      if ((ob->te_g).g_next == y) {
        (ob->te_g).g_next = y->g_next;
        break;
      }
    }
  }
  if (y->g_pd == scalar_class) {
    glist_valid = glist_valid + 1;
    x->gl_valid = glist_valid;
  }
  pd_free(&y->g_pd);
  if (_wasdeleting != (_rtext *)0x0) {
    rtext_free(_wasdeleting);
  }
  if (p_Var4 != (t_gotfn)0x0) {
    canvas_update_dsp();
  }
  if (iVar1 != 0) {
    p_Var5 = glist_getcanvas(x);
    ptVar3 = canvas_makebindsym(p_Var5->gl_name);
    ptVar6 = template_findbyname(ptVar3);
    canvas_redrawallfortemplate(ptVar6,1);
  }
  canvas_setdeleting(x_00,flag);
  return;
}

Assistant:

void glist_delete(t_glist *x, t_gobj *y)
{
    t_gobj *g;
    t_object *ob;
    t_gotfn chkdsp = zgetfn(&y->g_pd, gensym("dsp"));
    t_canvas *canvas = glist_getcanvas(x);
    t_rtext *rtext = 0;
    int drawcommand = class_isdrawcommand(y->g_pd);
    int wasdeleting;

    if (pd_class(&y->g_pd) == canvas_class) {
            /* JMZ: send a closebang to the canvas */
        canvas_closebang((t_canvas *)y);
    }

    wasdeleting = canvas_setdeleting(canvas, 1);
    if (x->gl_editor)
    {
            /* if we've grabbed events from canvas release them */
        if (canvas->gl_editor && canvas->gl_editor->e_grab == y)
            canvas->gl_editor->e_grab = 0;
                /* perhaps we grabbed our own glist instead? don't know if
                this ever happens: */
        if (x->gl_editor->e_grab == y)
            x->gl_editor->e_grab = 0;
        if (glist_isselected(x, y)) glist_deselect(x, y);

            /* HACK -- we had phantom outlets not getting erased on the
            screen because the canvas_setdeleting() mechanism is too
            crude.  LATER carefully set up rules for when the rtexts
            should exist, so that they stay around until all the
            steps of becoming invisible are done.  In the meantime, just
            zap the inlets and outlets here... */
        if (pd_class(&y->g_pd) == canvas_class)
        {
            t_glist *gl = (t_glist *)y;
            if (gl->gl_isgraph && glist_isvisible(x))
            {
                char tag[80];
                sprintf(tag, "graph%lx", (t_int)gl);
                glist_eraseiofor(x, &gl->gl_obj, tag);
            }
            else
            {
                if (glist_isvisible(x))
                    text_eraseborder(&gl->gl_obj, x,
                        rtext_gettag(glist_findrtext(x, &gl->gl_obj)));
            }
        }
    }
        /* if we're a drawing command, erase all scalars now, before deleting
        it; we'll redraw them once it's deleted below. */
    if (drawcommand)
        canvas_redrawallfortemplate(template_findbyname(canvas_makebindsym(
            glist_getcanvas(x)->gl_name)), 2);
    gobj_delete(y, x);
    if (glist_isvisible(canvas))
    {
        gobj_vis(y, x, 0);
    }
    if (x->gl_editor && (ob = pd_checkobject(&y->g_pd)) &&
        !(rtext = glist_findrtext(x, ob)))
            rtext = rtext_new(x, ob);
    if (x->gl_list == y) x->gl_list = y->g_next;
    else for (g = x->gl_list; g; g = g->g_next)
        if (g->g_next == y)
    {
        g->g_next = y->g_next;
        break;
    }
    if (y->g_pd == scalar_class)
        x->gl_valid = ++glist_valid;
    pd_free(&y->g_pd);
    if (rtext)
        rtext_free(rtext);
    if (chkdsp) canvas_update_dsp();
    if (drawcommand)
        canvas_redrawallfortemplate(template_findbyname(canvas_makebindsym(
            glist_getcanvas(x)->gl_name)), 1);
    canvas_setdeleting(canvas, wasdeleting);
}